

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int pageInsertArray(MemPage *pPg,u8 *pBegin,u8 **ppData,u8 *pCellptr,int iFirst,int nCell,
                   CellArray *pCArray)

{
  u8 *puVar1;
  u8 *__src;
  ushort uVar2;
  int iVar3;
  u8 *__dest;
  ulong uVar4;
  long lVar5;
  u8 *puVar6;
  int iVar7;
  ulong uVar8;
  int rc;
  u8 *local_78;
  int local_6c;
  ushort *local_58;
  int local_34;
  
  if (0 < nCell) {
    puVar1 = pPg->aData;
    local_78 = *ppData;
    iVar7 = nCell + iFirst;
    uVar8 = 0;
    do {
      uVar4 = uVar8;
      if (5 < uVar4) break;
      uVar8 = uVar4 + 1;
    } while (pCArray->ixNx[uVar4] <= iFirst);
    local_6c = (int)(uVar4 + 1) + -1;
    puVar6 = pCArray->apEnd[uVar4];
    local_58 = (ushort *)pCellptr;
    do {
      uVar2 = pCArray->szCell[iFirst];
      if (uVar2 == 0) {
        uVar2 = computeCellSize(pCArray,iFirst);
      }
      uVar8 = (ulong)(uint)uVar2;
      if (((puVar1[1] == '\0') && (puVar1[2] == '\0')) ||
         (__dest = pageFindSlot(pPg,(uint)uVar2,&local_34), __dest == (u8 *)0x0)) {
        iVar3 = 1;
        if ((long)uVar8 <= (long)local_78 - (long)pBegin) {
          __dest = local_78 + -uVar8;
          local_78 = __dest;
          goto LAB_00152129;
        }
      }
      else {
LAB_00152129:
        __src = pCArray->apCell[iFirst];
        if ((__src < puVar6) && (puVar6 < __src + uVar8)) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1122e,
                      "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
          iVar3 = 1;
        }
        else {
          memmove(__dest,__src,uVar8);
          uVar2 = (short)__dest - (short)puVar1;
          *local_58 = uVar2 * 0x100 | uVar2 >> 8;
          local_58 = local_58 + 1;
          iFirst = iFirst + 1;
          iVar3 = 6;
          if (iFirst < iVar7) {
            lVar5 = (long)local_6c;
            iVar3 = 0;
            if (pCArray->ixNx[lVar5] <= iFirst) {
              local_6c = local_6c + 1;
              puVar6 = pCArray->apEnd[lVar5 + 1];
            }
          }
        }
      }
    } while (iVar3 == 0);
    if (iVar3 != 6) {
      return 1;
    }
    *ppData = local_78;
  }
  return 0;
}

Assistant:

static int pageInsertArray(
  MemPage *pPg,                   /* Page to add cells to */
  u8 *pBegin,                     /* End of cell-pointer array */
  u8 **ppData,                    /* IN/OUT: Page content-area pointer */
  u8 *pCellptr,                   /* Pointer to cell-pointer area */
  int iFirst,                     /* Index of first cell to add */
  int nCell,                      /* Number of cells to add to pPg */
  CellArray *pCArray              /* Array of cells */
){
  int i = iFirst;                 /* Loop counter - cell index to insert */
  u8 *aData = pPg->aData;         /* Complete page */
  u8 *pData = *ppData;            /* Content area.  A subset of aData[] */
  int iEnd = iFirst + nCell;      /* End of loop. One past last cell to ins */
  int k;                          /* Current slot in pCArray->apEnd[] */
  u8 *pEnd;                       /* Maximum extent of cell data */
  assert( CORRUPT_DB || pPg->hdrOffset==0 );    /* Never called on page 1 */
  if( iEnd<=iFirst ) return 0;
  for(k=0; pCArray->ixNx[k]<=i && ALWAYS(k<NB*2); k++){}
  pEnd = pCArray->apEnd[k];
  while( 1 /*Exit by break*/ ){
    int sz, rc;
    u8 *pSlot;
    sz = cachedCellSize(pCArray, i);
    if( (aData[1]==0 && aData[2]==0) || (pSlot = pageFindSlot(pPg,sz,&rc))==0 ){
      if( (pData - pBegin)<sz ) return 1;
      pData -= sz;
      pSlot = pData;
    }
    /* pSlot and pCArray->apCell[i] will never overlap on a well-formed
    ** database.  But they might for a corrupt database.  Hence use memmove()
    ** since memcpy() sends SIGABORT with overlapping buffers on OpenBSD */
    assert( (pSlot+sz)<=pCArray->apCell[i]
         || pSlot>=(pCArray->apCell[i]+sz)
         || CORRUPT_DB );
    if( (uptr)(pCArray->apCell[i]+sz)>(uptr)pEnd
     && (uptr)(pCArray->apCell[i])<(uptr)pEnd
    ){
      assert( CORRUPT_DB );
      (void)SQLITE_CORRUPT_BKPT;
      return 1;
    }
    memmove(pSlot, pCArray->apCell[i], sz);
    put2byte(pCellptr, (pSlot - aData));
    pCellptr += 2;
    i++;
    if( i>=iEnd ) break;
    if( pCArray->ixNx[k]<=i ){
      k++;
      pEnd = pCArray->apEnd[k];
    }
  }
  *ppData = pData;
  return 0;
}